

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bf_crc.cc
# Opt level: O2

void __thiscall
bf_crc::show_hit(bf_crc *this,crc_model_t model,
                vector<bf_crc::vector_,_std::allocator<bf_crc::vector_>_> *test_vectors)

{
  pointer pvVar1;
  ostream *poVar2;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  bool v;
  bool v_00;
  char *pcVar5;
  allocator<char> local_411;
  ulong local_410;
  ulong local_408;
  uint32_t local_400;
  int local_3fc;
  int local_3f8;
  uint32_t local_3f4;
  string local_3f0;
  string local_3d0;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  
  if (this->quiet_ == false) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "----------------------------[ MATCH ]--------------------------------\n"
                            );
    poVar2 = std::operator<<(poVar2,"Found a model for the CRC calculation:\n");
    poVar2 = std::operator<<(poVar2,"Truncated polynom : 0x");
    *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) & 0xffffffb5 | 8;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2," (");
    *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    local_408 = (ulong)model.polynomial;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,")\n");
    poVar2 = std::operator<<(poVar2,"Initial value     : 0x");
    *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) & 0xffffffb5 | 8;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2," (");
    *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    local_410 = (ulong)model.initial;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,")\n");
    poVar2 = std::operator<<(poVar2,"Final XOR         : 0x");
    *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) & 0xffffffb5 | 8;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2," (");
    *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar2->field_0x18 + (long)poVar2->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,")\n");
    poVar2 = std::operator<<(poVar2,"Reflected input   : ");
    bool_to_str_abi_cxx11_((string *)&local_1f0,(bf_crc *)(ulong)model.reflected_input,v);
    poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"Reflected output  : ");
    bool_to_str_abi_cxx11_((string *)&local_2d0,(bf_crc *)(ulong)model.reflected_output,v_00);
    poVar2 = std::operator<<(poVar2,(string *)&local_2d0);
    poVar2 = std::operator<<(poVar2,"\n");
    pcVar5 = "Feed type         : ";
    poVar2 = std::operator<<(poVar2,"Feed type         : ");
    feed_type_to_str_abi_cxx11_((string *)&local_3b0,(bf_crc *)pcVar5,model.feed_type);
    poVar2 = std::operator<<(poVar2,(string *)&local_3b0);
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::ostream::flush();
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_1f0);
    if ((((model.feed_type == BYTEWISE_REVERSED) || (model.feed_type == AUTO)) &&
        (pvVar1 = (test_vectors->
                  super__Vector_base<bf_crc::vector_,_std::allocator<bf_crc::vector_>_>)._M_impl.
                  super__Vector_impl_data._M_start,
        (test_vectors->super__Vector_base<bf_crc::vector_,_std::allocator<bf_crc::vector_>_>).
        _M_impl.super__Vector_impl_data._M_finish != pvVar1)) &&
       (((pvVar1->message).m_num_bits & 7) == 0)) {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "----------------------------[ Example implementation ]--------------------------------"
                              );
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,"#include <stdint.h>");
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,"#include <stdio.h>");
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,"#define STANDARD_FEEDING (7-i)");
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,"#define BYTEWISE_REVERSE_FEEDING (i)");
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,"#define FEEDING ");
      pcVar5 = "STANDARD_FEEDING";
      if (model.reflected_input != false) {
        pcVar5 = "BYTEWISE_REVERSE_FEEDING";
      }
      poVar2 = std::operator<<(poVar2,pcVar5);
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      if (model.reflected_output == false) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"",&local_411);
      }
      else {
        show_reflect_output_abi_cxx11_(&local_3f0,(bf_crc *)pcVar5);
      }
      poVar2 = std::operator<<(poVar2,(string *)&local_3f0);
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,
                               "uint16_t calc_crc(uint16_t poly, uint16_t initial, uint16_t final_xor, uint8_t * buf, unsigned int len) {"
                              );
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,"  uint16_t crc = initial;");
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,"  unsigned int i, k;");
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      pcVar5 = "";
      poVar2 = std::operator<<(poVar2,"");
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,"  for(k = 0; k < len; k++ ) {");
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,"    for(i = 0; i < 8; i++ ) {");
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,"      int bit = ((buf[k] >> FEEDING & 1) == 1);");
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,"      int c15 = ((crc >> 15 & 1) == 1);");
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,"      crc <<= 1;");
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,"      if(c15 ^ bit) crc ^= poly;");
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,"    }");
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,"  }");
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      if (model.reflected_output != false) {
        pcVar5 = "  crc = reflect_output(crc);";
      }
      poVar2 = std::operator<<(poVar2,pcVar5);
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,"  crc ^= final_xor;");
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,"  return crc;");
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,"}");
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,"int main(int argc, char * argv) {");
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,"");
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,"  uint8_t buf[] = { ");
      bitset_to_byte_array_abi_cxx11_
                (&local_3d0,
                 &((test_vectors->
                   super__Vector_base<bf_crc::vector_,_std::allocator<bf_crc::vector_>_>)._M_impl.
                   super__Vector_impl_data._M_start)->message);
      poVar2 = std::operator<<(poVar2,(string *)&local_3d0);
      poVar2 = std::operator<<(poVar2,"};");
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,"  uint16_t crc = ");
      boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                (&local_1f0,"0x%04x");
      local_3f4 = ((test_vectors->
                   super__Vector_base<bf_crc::vector_,_std::allocator<bf_crc::vector_>_>)._M_impl.
                   super__Vector_impl_data._M_start)->crc;
      pbVar3 = boost::io::detail::feed<char,std::char_traits<char>,std::allocator<char>,int_const&>
                         (&local_1f0,(int *)&local_3f4);
      pbVar4 = boost::operator<<(poVar2,pbVar3);
      poVar2 = std::operator<<(pbVar4,";");
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,"  ");
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,"  if(calc_crc( ");
      boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                (&local_2d0,"0x%04x");
      local_3f8 = (int)local_408;
      pbVar3 = boost::io::detail::feed<char,std::char_traits<char>,std::allocator<char>,int_const&>
                         (&local_2d0,&local_3f8);
      pbVar4 = boost::operator<<(poVar2,pbVar3);
      poVar2 = std::operator<<(pbVar4,", ");
      boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                (&local_3b0,"0x%04x");
      local_3fc = (int)local_410;
      pbVar3 = boost::io::detail::feed<char,std::char_traits<char>,std::allocator<char>,int_const&>
                         (&local_3b0,&local_3fc);
      pbVar4 = boost::operator<<(poVar2,pbVar3);
      poVar2 = std::operator<<(pbVar4,", ");
      boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                (&local_110,"0x%04x");
      local_400 = model.final_xor;
      pbVar3 = boost::io::detail::feed<char,std::char_traits<char>,std::allocator<char>,int_const&>
                         (&local_110,(int *)&local_400);
      pbVar4 = boost::operator<<(poVar2,pbVar3);
      poVar2 = std::operator<<(pbVar4,", buf, sizeof(buf)) == crc) puts(\"CRC matches\");");
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,"  else puts(\"CRC does not match\");");
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,"  ");
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<(poVar2,"}");
      std::endl<char,std::char_traits<char>>(poVar2);
      boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_format
                (&local_110);
      boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_format
                (&local_3b0);
      boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_format
                (&local_2d0);
      boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_format
                (&local_1f0);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::__cxx11::string::~string((string *)&local_3f0);
    }
  }
  return;
}

Assistant:

void bf_crc::show_hit(crc_model_t model, std::vector<test_vector_t> test_vectors) {

  if (quiet_) return;


  std::cout 
    << "----------------------------[ MATCH ]--------------------------------\n"
    << "Found a model for the CRC calculation:\n"
    << "Truncated polynom : 0x" << std::hex << model.polynomial << " (" << std::dec << model.polynomial << ")\n"
    << "Initial value     : 0x" << std::hex << model.initial << " (" << std::dec << model.initial << ")\n"
    << "Final XOR         : 0x" << std::hex << model.final_xor << " (" << std::dec << model.final_xor << ")\n"
    << "Reflected input   : " << bool_to_str(model.reflected_input) << "\n"
    << "Reflected output  : " << bool_to_str(model.reflected_output) << "\n"
    << "Feed type         : " << feed_type_to_str(model.feed_type) << std::endl
    << std::endl << std::flush;

  
  // print an implementation
  
  if((model.feed_type == my_crc_basic::BYTEWISE_REVERSED || model.feed_type == my_crc_basic::AUTO) &&
     (test_vectors.size() > 0) &&
     (test_vectors[0].message.size() % 8 == 0)) {
    
    std::cout 
      << "----------------------------[ Example implementation ]--------------------------------" << std::endl
      << "#include <stdint.h>" << std::endl
      << "#include <stdio.h>" << std::endl
      << std::endl
      << "#define STANDARD_FEEDING (7-i)" << std::endl
      << "#define BYTEWISE_REVERSE_FEEDING (i)" << std::endl
      << "#define FEEDING " << (model.reflected_input == true ? "BYTEWISE_REVERSE_FEEDING" : "STANDARD_FEEDING") << std::endl
      << std::endl
      << (model.reflected_output == true ? show_reflect_output() : std::string("")) << std::endl
      << "uint16_t calc_crc(uint16_t poly, uint16_t initial, uint16_t final_xor, uint8_t * buf, unsigned int len) {" << std::endl
      << "  uint16_t crc = initial;" << std::endl
      << "  unsigned int i, k;" << std::endl
      << "" << std::endl
      << "  for(k = 0; k < len; k++ ) {" << std::endl
      << "    for(i = 0; i < 8; i++ ) {" << std::endl
      << "      int bit = ((buf[k] >> FEEDING & 1) == 1);" << std::endl
      << "      int c15 = ((crc >> 15 & 1) == 1);" << std::endl
      << "      crc <<= 1;" << std::endl
      << "      if(c15 ^ bit) crc ^= poly;" << std::endl
      << "    }" << std::endl
      << "  }" << std::endl
      << (model.reflected_output == true ? "  crc = reflect_output(crc);" : "") << std::endl
      << "  crc ^= final_xor;" << std::endl
      << "  return crc;" << std::endl
      << "}" << std::endl
      << std::endl
      << "int main(int argc, char * argv) {" << std::endl
      << "" << std::endl
      << "  uint8_t buf[] = { " << bitset_to_byte_array(test_vectors[0].message) << "};" << std::endl
      << "  uint16_t crc = " << (boost::format("0x%04x") % static_cast<int>(test_vectors[0].crc)) << ";" << std::endl
      << "  " << std::endl
      << "  if(calc_crc( "<< (boost::format("0x%04x") % static_cast<int>(model.polynomial)) << ", " 
      << (boost::format("0x%04x") % static_cast<int>(model.initial)) << ", " 
      << (boost::format("0x%04x") % static_cast<int>(model.final_xor)) << ", buf, sizeof(buf)) == crc) puts(\"CRC matches\");" << std::endl
      << "  else puts(\"CRC does not match\");" << std::endl
      << "  " << std::endl
      << "}" << std::endl;
    
  }
}